

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O2

void duckdb::ValidityUncompressed::AlignedScan
               (data_ptr_t input,idx_t input_start,Vector *result,idx_t scan_count)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  idx_t i;
  ulong uVar3;
  
  FlatVector::VerifyFlatVector(result);
  puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  for (uVar3 = 0; scan_count + 0x3f >> 6 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = *(unsigned_long *)(input + uVar3 * 8 + (input_start >> 6) * 8);
    if ((puVar2 == (unsigned_long *)0x0) && (uVar1 == 0xffffffffffffffff)) {
      puVar2 = (unsigned_long *)0x0;
    }
    else {
      if (puVar2 == (unsigned_long *)0x0) {
        TemplatedValidityMask<unsigned_long>::Initialize
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>);
        puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      }
      puVar2[uVar3] = uVar1;
    }
  }
  return;
}

Assistant:

void ValidityUncompressed::AlignedScan(data_ptr_t input, idx_t input_start, Vector &result, idx_t scan_count) {
	D_ASSERT(input_start % ValidityMask::BITS_PER_VALUE == 0);

	// aligned scan: no need to do anything fancy
	// note: this is only an optimization which avoids having to do messy bitshifting in the common case
	// it is not required for correctness
	auto &result_mask = FlatVector::Validity(result);
	auto input_data = reinterpret_cast<validity_t *>(input);
	auto result_data = result_mask.GetData();
	idx_t start_offset = input_start / ValidityMask::BITS_PER_VALUE;
	idx_t entry_scan_count = (scan_count + ValidityMask::BITS_PER_VALUE - 1) / ValidityMask::BITS_PER_VALUE;
	for (idx_t i = 0; i < entry_scan_count; i++) {
		auto input_entry = input_data[start_offset + i];
		if (!result_data && input_entry == ValidityMask::ValidityBuffer::MAX_ENTRY) {
			continue;
		}
		if (!result_data) {
			result_mask.Initialize();
			result_data = result_mask.GetData();
		}
		result_data[i] = input_entry;
	}
}